

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void divide_subset_split<float,int>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double split_point,MissingAction missing_action,size_t *st_NA,
               size_t *end_NA,size_t *split_ix)

{
  unsigned_long uVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int *piVar8;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  bool bVar9;
  double in_XMM0_Qa;
  long in_stack_00000008;
  int in_stack_00000010;
  long *in_stack_00000018;
  long *in_stack_00000020;
  long *in_stack_00000028;
  size_t *row_4;
  size_t *row_3;
  size_t *r_3;
  size_t *r_2;
  size_t *row_2;
  bool has_NAs;
  size_t *row_1;
  size_t *r_1;
  size_t *r;
  size_t *row;
  size_t *ptr_st;
  bool move_zeros;
  size_t temp;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  unsigned_long *in_stack_fffffffffffffe98;
  unsigned_long *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  undefined1 uVar10;
  unsigned_long *in_stack_fffffffffffffeb0;
  long local_d8;
  long local_d0;
  long local_c8;
  ulong *local_c0;
  ulong *local_b8;
  unsigned_long *local_b0;
  unsigned_long *local_a8;
  unsigned_long *local_a0;
  ulong *local_90;
  unsigned_long *local_88;
  unsigned_long *local_80;
  unsigned_long *local_78;
  ulong local_50;
  long local_10;
  
  if (*(int *)(in_stack_00000008 + in_RCX * 4) == *(int *)(in_stack_00000008 + 4 + in_RCX * 4)) {
    if (in_stack_00000010 == 0) {
      local_c8 = in_RSI;
      if (0.0 <= in_XMM0_Qa) {
        local_c8 = in_RDX + 1;
      }
      *in_stack_00000028 = local_c8;
    }
    else {
      local_d0 = in_RSI;
      if (0.0 <= in_XMM0_Qa) {
        local_d0 = in_RDX + 1;
      }
      *in_stack_00000018 = local_d0;
      local_d8 = in_RSI;
      if (0.0 <= in_XMM0_Qa) {
        local_d8 = in_RDX + 1;
      }
      *in_stack_00000020 = local_d8;
    }
  }
  uVar5 = (ulong)*(int *)(in_stack_00000008 + in_RCX * 4);
  uVar6 = (ulong)(*(int *)(in_stack_00000008 + 4 + in_RCX * 4) + -1);
  uVar7 = (ulong)*(int *)(in_R9 + uVar6 * 4);
  bVar9 = 0.0 <= in_XMM0_Qa;
  local_b8 = std::lower_bound<unsigned_long*,int>
                       (in_stack_fffffffffffffeb0,
                        (unsigned_long *)
                        CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                        (int *)in_stack_fffffffffffffea0);
  local_10 = in_RSI;
  if ((bVar9) && ((unsigned_long *)(in_RDI + in_RSI * 8) < local_b8)) {
    local_10 = (long)local_b8 - in_RDI >> 3;
  }
  local_50 = uVar5;
  if (in_stack_00000010 == 0) {
    local_90 = local_b8;
    local_78 = local_b8;
    if (bVar9) {
LAB_00476273:
      while (local_78 != (unsigned_long *)(in_RDI + in_RDX * 8 + 8)) {
        if (uVar6 + 1 <= local_50) {
          for (local_80 = local_78; local_80 <= (unsigned_long *)(in_RDI + in_RDX * 8);
              local_80 = local_80 + 1) {
            uVar1 = *(unsigned_long *)(in_RDI + local_10 * 8);
            *(unsigned_long *)(in_RDI + local_10 * 8) = *local_80;
            *local_80 = uVar1;
            local_10 = local_10 + 1;
          }
          break;
        }
        if (*(int *)(in_R9 + local_50 * 4) == (int)*local_78) {
          if ((double)*(float *)(in_R8 + local_50 * 4) <= in_XMM0_Qa) {
            uVar1 = *(unsigned_long *)(in_RDI + local_10 * 8);
            *(unsigned_long *)(in_RDI + local_10 * 8) = *local_78;
            *local_78 = uVar1;
            local_10 = local_10 + 1;
          }
          if ((local_50 == uVar6) &&
             (local_88 = local_78, local_78 < (unsigned_long *)(in_RDI + in_RDX * 8))) {
            while (local_88 = local_88 + 1, local_88 <= (unsigned_long *)(in_RDI + in_RDX * 8)) {
              uVar1 = *(unsigned_long *)(in_RDI + local_10 * 8);
              *(unsigned_long *)(in_RDI + local_10 * 8) = *local_88;
              *local_88 = uVar1;
              local_10 = local_10 + 1;
            }
          }
          if ((local_78 != (unsigned_long *)(in_RDI + in_RDX * 8)) && (local_50 != uVar6))
          goto LAB_0047654e;
          break;
        }
        if ((int)*local_78 < *(int *)(in_R9 + local_50 * 4)) {
          while( true ) {
            bVar9 = false;
            if (local_78 <= (unsigned_long *)(in_RDI + in_RDX * 8)) {
              bVar9 = (int)*local_78 < *(int *)(in_R9 + local_50 * 4);
            }
            if (!bVar9) break;
            uVar1 = *(unsigned_long *)(in_RDI + local_10 * 8);
            *(unsigned_long *)(in_RDI + local_10 * 8) = *local_78;
            *local_78 = uVar1;
            local_10 = local_10 + 1;
            local_78 = local_78 + 1;
          }
        }
        else {
          piVar8 = std::lower_bound<int*,unsigned_long>
                             ((int *)in_stack_fffffffffffffeb0,
                              (int *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                              in_stack_fffffffffffffea0);
          local_50 = (long)piVar8 - in_R9 >> 2;
        }
      }
      goto LAB_004769c3;
    }
    while( true ) {
      bVar9 = false;
      if ((local_90 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (bVar9 = false, local_50 != uVar6 + 1)
         ) {
        bVar9 = *local_90 <= uVar7;
      }
      if (!bVar9) break;
      if (*(int *)(in_R9 + local_50 * 4) == (int)*local_90) {
        if ((double)*(float *)(in_R8 + local_50 * 4) <= in_XMM0_Qa) {
          uVar5 = *(ulong *)(in_RDI + local_10 * 8);
          *(ulong *)(in_RDI + local_10 * 8) = *local_90;
          *local_90 = uVar5;
          local_10 = local_10 + 1;
        }
        if ((local_90 == (ulong *)(in_RDI + in_RDX * 8)) || (local_50 == uVar6)) break;
        local_90 = local_90 + 1;
        piVar8 = std::lower_bound<int*,unsigned_long>
                           ((int *)in_stack_fffffffffffffeb0,
                            (int *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                            in_stack_fffffffffffffea0);
        local_50 = (long)piVar8 - in_R9 >> 2;
      }
      else if ((int)*local_90 < *(int *)(in_R9 + local_50 * 4)) {
        local_90 = std::lower_bound<unsigned_long*,int>
                             (in_stack_fffffffffffffeb0,
                              (unsigned_long *)
                              CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                              (int *)in_stack_fffffffffffffea0);
      }
      else {
        piVar8 = std::lower_bound<int*,unsigned_long>
                           ((int *)in_stack_fffffffffffffeb0,
                            (int *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                            in_stack_fffffffffffffea0);
        local_50 = (long)piVar8 - in_R9 >> 2;
      }
    }
LAB_004769c3:
    *in_stack_00000028 = local_10;
  }
  else {
    bVar3 = false;
    local_a0 = local_b8;
    if (bVar9) {
LAB_00476a01:
      while (local_a0 != (unsigned_long *)(in_RDI + in_RDX * 8 + 8)) {
        if (uVar6 + 1 <= local_50) {
          for (local_a8 = local_a0; local_a8 <= (unsigned_long *)(in_RDI + in_RDX * 8);
              local_a8 = local_a8 + 1) {
            uVar1 = *(unsigned_long *)(in_RDI + local_10 * 8);
            *(unsigned_long *)(in_RDI + local_10 * 8) = *local_a8;
            *local_a8 = uVar1;
            local_10 = local_10 + 1;
          }
          break;
        }
        if (*(int *)(in_R9 + local_50 * 4) == (int)*local_a0) {
          uVar4 = std::isnan((double)(ulong)*(uint *)(in_R8 + local_50 * 4));
          if ((uVar4 & 1) == 0) {
            if ((double)*(float *)(in_R8 + local_50 * 4) <= in_XMM0_Qa) {
              uVar1 = *(unsigned_long *)(in_RDI + local_10 * 8);
              *(unsigned_long *)(in_RDI + local_10 * 8) = *local_a0;
              *local_a0 = uVar1;
              local_10 = local_10 + 1;
            }
          }
          else {
            bVar3 = true;
          }
          if ((local_50 == uVar6) &&
             (local_b0 = local_a0, local_a0 < (unsigned_long *)(in_RDI + in_RDX * 8))) {
            while (local_b0 = local_b0 + 1, local_b0 <= (unsigned_long *)(in_RDI + in_RDX * 8)) {
              uVar1 = *(unsigned_long *)(in_RDI + local_10 * 8);
              *(unsigned_long *)(in_RDI + local_10 * 8) = *local_b0;
              *local_b0 = uVar1;
              local_10 = local_10 + 1;
            }
          }
          if ((local_a0 != (unsigned_long *)(in_RDI + in_RDX * 8)) && (local_50 != uVar6))
          goto LAB_00476d0b;
          break;
        }
        if ((int)*local_a0 < *(int *)(in_R9 + local_50 * 4)) {
          while( true ) {
            bVar9 = false;
            if (local_a0 <= (unsigned_long *)(in_RDI + in_RDX * 8)) {
              bVar9 = (int)*local_a0 < *(int *)(in_R9 + local_50 * 4);
            }
            if (!bVar9) break;
            uVar1 = *(unsigned_long *)(in_RDI + local_10 * 8);
            *(unsigned_long *)(in_RDI + local_10 * 8) = *local_a0;
            *local_a0 = uVar1;
            local_10 = local_10 + 1;
            local_a0 = local_a0 + 1;
          }
        }
        else {
          piVar8 = std::lower_bound<int*,unsigned_long>
                             ((int *)in_stack_fffffffffffffeb0,
                              (int *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                              in_stack_fffffffffffffea0);
          local_50 = (long)piVar8 - in_R9 >> 2;
        }
      }
      goto LAB_004771b5;
    }
    while( true ) {
      bVar9 = false;
      if ((local_b8 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (bVar9 = false, local_50 != uVar6 + 1)
         ) {
        bVar9 = *local_b8 <= uVar7;
      }
      if (!bVar9) break;
      if (*(int *)(in_R9 + local_50 * 4) == (int)*local_b8) {
        uVar4 = std::isnan((double)(ulong)*(uint *)(in_R8 + local_50 * 4));
        if ((uVar4 & 1) != 0) {
          bVar3 = true;
        }
        uVar4 = std::isnan((double)(ulong)*(uint *)(in_R8 + local_50 * 4));
        if (((uVar4 & 1) == 0) && ((double)*(float *)(in_R8 + local_50 * 4) <= in_XMM0_Qa)) {
          uVar2 = *(ulong *)(in_RDI + local_10 * 8);
          *(ulong *)(in_RDI + local_10 * 8) = *local_b8;
          *local_b8 = uVar2;
          local_10 = local_10 + 1;
        }
        if ((local_b8 == (ulong *)(in_RDI + in_RDX * 8)) || (local_50 == uVar6)) break;
        local_b8 = local_b8 + 1;
        piVar8 = std::lower_bound<int*,unsigned_long>
                           ((int *)in_stack_fffffffffffffeb0,
                            (int *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                            in_stack_fffffffffffffea0);
        local_50 = (long)piVar8 - in_R9 >> 2;
      }
      else if ((int)*local_b8 < *(int *)(in_R9 + local_50 * 4)) {
        local_b8 = std::lower_bound<unsigned_long*,int>
                             (in_stack_fffffffffffffeb0,
                              (unsigned_long *)
                              CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                              (int *)in_stack_fffffffffffffea0);
      }
      else {
        in_stack_fffffffffffffeb0 =
             (unsigned_long *)
             std::lower_bound<int*,unsigned_long>
                       ((int *)in_stack_fffffffffffffeb0,
                        (int *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                        in_stack_fffffffffffffea0);
        local_50 = (long)in_stack_fffffffffffffeb0 - in_R9 >> 2;
      }
    }
LAB_004771b5:
    *in_stack_00000018 = local_10;
    if (bVar3) {
      std::sort<unsigned_long*>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      local_c0 = (ulong *)(in_RDI + local_10 * 8);
      local_50 = uVar5;
      while( true ) {
        uVar10 = false;
        if ((local_c0 != (ulong *)(in_RDI + in_RDX * 8 + 8)) &&
           (uVar10 = false, local_50 != uVar6 + 1)) {
          uVar10 = *local_c0 <= uVar7;
        }
        if ((bool)uVar10 == false) break;
        if (*(int *)(in_R9 + local_50 * 4) == (int)*local_c0) {
          uVar4 = std::isnan((double)(ulong)*(uint *)(in_R8 + local_50 * 4));
          if ((uVar4 & 1) != 0) {
            uVar5 = *(ulong *)(in_RDI + local_10 * 8);
            *(ulong *)(in_RDI + local_10 * 8) = *local_c0;
            *local_c0 = uVar5;
            local_10 = local_10 + 1;
          }
          if ((local_c0 == (ulong *)(in_RDI + in_RDX * 8)) || (local_50 == uVar6)) break;
          local_c0 = local_c0 + 1;
          in_stack_fffffffffffffea0 =
               (unsigned_long *)
               std::lower_bound<int*,unsigned_long>
                         ((int *)in_stack_fffffffffffffeb0,
                          (int *)CONCAT17(uVar10,in_stack_fffffffffffffea8),
                          in_stack_fffffffffffffea0);
          local_50 = (long)in_stack_fffffffffffffea0 - in_R9 >> 2;
        }
        else if ((int)*local_c0 < *(int *)(in_R9 + local_50 * 4)) {
          local_c0 = std::lower_bound<unsigned_long*,int>
                               (in_stack_fffffffffffffeb0,
                                (unsigned_long *)CONCAT17(uVar10,in_stack_fffffffffffffea8),
                                (int *)in_stack_fffffffffffffea0);
        }
        else {
          piVar8 = std::lower_bound<int*,unsigned_long>
                             ((int *)in_stack_fffffffffffffeb0,
                              (int *)CONCAT17(uVar10,in_stack_fffffffffffffea8),
                              in_stack_fffffffffffffea0);
          local_50 = (long)piVar8 - in_R9 >> 2;
        }
      }
    }
    *in_stack_00000020 = local_10;
  }
  return;
LAB_00476d0b:
  local_a0 = local_a0 + 1;
  piVar8 = std::lower_bound<int*,unsigned_long>
                     ((int *)in_stack_fffffffffffffeb0,
                      (int *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                      in_stack_fffffffffffffea0);
  local_50 = (long)piVar8 - in_R9 >> 2;
  goto LAB_00476a01;
LAB_0047654e:
  local_78 = local_78 + 1;
  piVar8 = std::lower_bound<int*,unsigned_long>
                     ((int *)in_stack_fffffffffffffeb0,
                      (int *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                      in_stack_fffffffffffffea0);
  local_50 = (long)piVar8 - in_R9 >> 2;
  goto LAB_00476273;
}

Assistant:

void divide_subset_split(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                         real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr, double split_point,
                         MissingAction missing_action, size_t &restrict st_NA, size_t &restrict end_NA, size_t &restrict split_ix) noexcept
{
    /* TODO: this is a mess, needs refactoring */
    /* TODO: when moving zeros, would be better to instead move by '>' (opposite as in here) */
    /* TODO: should create an extra version to go along with 'predict' that would
       add the range penalty right here to spare operations. */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        if (missing_action == Fail)
        {
            split_ix = (0 <= split_point)? (end+1) : st;
        }

        else
        {
            st_NA  = (0 <= split_point)? (end+1) : st;
            end_NA = (0 <= split_point)? (end+1) : st;
        }

    }

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t temp;
    bool   move_zeros = 0 <= split_point;
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    if (move_zeros && ptr_st > ix_arr + st)
        st = ptr_st - ix_arr;

    if (missing_action == Fail)
    {
        if (move_zeros)
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1;
                )
            {
                if (curr_pos >= end_col + 1)
                {
                    for (size_t *r = row; r <= ix_arr + end; r++)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *r;
                        *r         = temp;
                        st++;
                    }
                    break;
                }

                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (curr_pos == end_col && row < ix_arr + end)
                    {
                        for (size_t *r = row + 1; r <= ix_arr + end; r++)
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *r;
                            *r         = temp;
                            st++;
                        }
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    {
                        while (row <= ix_arr + end && Xc_ind[curr_pos] > (sparse_ix)(*row))
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *row;
                            *row       = temp;
                            st++; row++;
                        }
                    }

                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }

        else /* don't move zeros */
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }

        split_ix = st;
    }

    else /* can have NAs */
    {

        bool has_NAs = false;
        if (move_zeros)
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1;
                )
            {
                if (curr_pos >= end_col + 1)
                {
                    for (size_t *r = row; r <= ix_arr + end; r++)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *r;
                        *r         = temp;
                        st++;
                    }
                    break;
                }

                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos])))
                        has_NAs = true;
                    else if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (curr_pos == end_col && row < ix_arr + end)
                        for (size_t *r = row + 1; r <= ix_arr + end; r++)
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *r;
                            *r         = temp;
                            st++;
                        }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    {
                        while (row <= ix_arr + end && Xc_ind[curr_pos] > (sparse_ix)(*row))
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *row;
                            *row       = temp;
                            st++; row++;
                        }
                    }

                    else
                    {
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                    }
                }
            }
        }

        else /* don't move zeros */
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos]))) has_NAs = true;
                    if (!std::isnan(Xc[curr_pos]) && Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }


        st_NA = st;
        if (has_NAs)
        {
            curr_pos = st_col;
            std::sort(ix_arr + st, ix_arr + end + 1);
            for (size_t *row = ix_arr + st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos])))
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }
        end_NA = st;

    }

}